

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O0

cmArgumentParser<(anonymous_namespace)::Result> * __thiscall
cmArgumentParser<(anonymous_namespace)::Result>::Bind
          (cmArgumentParser<(anonymous_namespace)::Result> *this,size_t position,
          offset_in_Result_to_optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          member)

{
  anon_class_8_1_60e67bd8 local_48;
  PositionAction local_40;
  offset_in_Result_to_optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  offset_in_Result_to_optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  member_local;
  size_t position_local;
  cmArgumentParser<(anonymous_namespace)::Result> *this_local;
  
  local_48.member = member;
  local_20 = member;
  member_local = position;
  position_local = (size_t)this;
  std::
  function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>
  ::
  function<cmArgumentParser<(anonymous_namespace)::Result>::Bind(unsigned_long,std::optional<std::__cxx11::string>(anonymous_namespace)::Result::*)::_lambda(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)_1_,void>
            ((function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>
              *)&local_40,&local_48);
  ArgumentParser::Base::Bind(&this->super_Base,position,&local_40);
  std::
  function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function(&local_40);
  return this;
}

Assistant:

cmArgumentParser& Bind(std::size_t position,
                         cm::optional<std::string> Result::*member)
  {
    this->Base::Bind(
      position,
      [member](Instance& instance, std::size_t, cm::string_view arg) {
        Result* result = static_cast<Result*>(instance.Result);
        result->*member = arg;
      });
    return *this;
  }